

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O3

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::core::engine::DataManWriter::PopBufferQueue(DataManWriter *this)

{
  undefined8 *puVar1;
  pointer pcVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x690));
  if (iVar3 == 0) {
    puVar1 = *(undefined8 **)(in_RSI + 0x650);
    if (*(undefined8 **)(in_RSI + 0x670) == puVar1) {
      (this->super_Engine)._vptr_Engine = (_func_int **)0x0;
      (this->super_Engine).m_EngineType._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      (this->super_Engine)._vptr_Engine = (_func_int **)*puVar1;
      pcVar2 = (pointer)puVar1[1];
      (this->super_Engine).m_EngineType._M_dataplus._M_p = pcVar2;
      if (pcVar2 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
        }
      }
      std::
      deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
      ::pop_front((deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
                   *)(in_RSI + 0x640));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x690));
    sVar4.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar4.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
           sVar4.
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

std::shared_ptr<std::vector<char>> DataManWriter::PopBufferQueue()
{
    std::lock_guard<std::mutex> l(m_BufferQueueMutex);
    if (m_BufferQueue.empty())
    {
        return nullptr;
    }
    else
    {
        auto ret = m_BufferQueue.front();
        m_BufferQueue.pop();
        return ret;
    }
}